

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_int8.h
# Opt level: O0

void ncnn::lstm_dynamic_quantize_scale2int8(float *ptr,int size,float scale,char *outptr)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [56];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  float fVar14;
  float fVar15;
  undefined8 uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  char *in_RDX;
  int in_ESI;
  undefined1 (*in_RDI) [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  float in_XMM0_Da;
  double dVar25;
  undefined1 auVar26 [32];
  __m128 _p_2;
  __m128 _scale;
  __m256 _p_1;
  __m256 _scale_avx;
  __m128i _outp;
  __m512 _p;
  __m128i _v127;
  __m512 _scale_avx512;
  int i;
  __m128i _v8;
  __m512i _v0_i;
  __m512 _v0_adj;
  __m512 _v0_p5;
  __m512 _sign;
  __m512 _signmask;
  __m512 _p5;
  __m128i _v8_1;
  __m256i _v0_i_1;
  __m256 _v0_adj_1;
  __m256 _v0_p5_1;
  __m256 _sign_1;
  __m256 _signmask_1;
  __m256 _p5_1;
  __m128i _v8_2;
  __m128i _v0_s16;
  __m128i _v0_i_2;
  __m128 _v0_adj_2;
  __m128 _v0_p5_2;
  __m128 _sign0;
  __m128 _signmask_2;
  __m128 _p5_2;
  int int32;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined1 local_e90 [16];
  undefined1 local_e80 [64];
  undefined8 local_e10;
  undefined8 uStack_e08;
  undefined1 local_e00 [64];
  int local_d84;
  char *local_d80;
  float local_d78;
  int local_d74;
  undefined1 (*local_d70) [64];
  undefined1 (*local_d68) [64];
  undefined8 local_d60;
  undefined8 uStack_d58;
  char *local_d48;
  undefined1 local_d40 [64];
  undefined1 local_cf1;
  undefined1 local_cf0 [16];
  undefined1 local_cd8;
  undefined1 local_cd7;
  undefined1 local_cd6;
  undefined1 local_cd5;
  undefined1 local_cd4;
  undefined1 local_cd3;
  undefined1 local_cd2;
  undefined1 local_cd1;
  undefined1 local_cd0;
  undefined1 local_ccf;
  undefined1 local_cce;
  undefined1 local_ccd;
  undefined1 local_ccc;
  undefined1 local_ccb;
  undefined1 local_cca;
  undefined1 local_cc9;
  undefined1 (*local_cc8) [64];
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 uStack_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined1 local_c10 [16];
  undefined1 local_c00 [64];
  undefined1 local_bc0 [64];
  undefined1 local_b80 [64];
  undefined1 local_b40 [64];
  undefined1 local_b00 [64];
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined1 *local_a48;
  undefined1 local_a40 [64];
  undefined1 local_a00 [64];
  undefined4 local_9b8;
  undefined1 local_9b1;
  undefined1 local_9b0 [16];
  undefined1 local_9a0;
  undefined1 local_99f;
  undefined1 local_99e;
  undefined1 local_99d;
  undefined1 local_99c;
  undefined1 local_99b;
  undefined1 local_99a;
  undefined1 local_999;
  undefined1 local_998;
  undefined1 local_997;
  undefined1 local_996;
  undefined1 local_995;
  undefined1 local_994;
  undefined1 local_993;
  undefined1 local_992;
  undefined1 local_991;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined1 (*local_968) [64];
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined1 local_910 [16];
  int local_900;
  int iStack_8fc;
  int iStack_8f8;
  int iStack_8f4;
  int iStack_8f0;
  int iStack_8ec;
  int iStack_8e8;
  int iStack_8e4;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 *local_830;
  undefined1 local_821;
  undefined1 local_820 [16];
  undefined1 local_804;
  undefined1 local_803;
  undefined1 local_802;
  undefined1 local_801;
  undefined1 local_800;
  undefined1 local_7ff;
  undefined1 local_7fe;
  undefined1 local_7fd;
  undefined1 local_7fc;
  undefined1 local_7fb;
  undefined1 local_7fa;
  undefined1 local_7f9;
  undefined1 local_7f8;
  undefined1 local_7f7;
  undefined1 local_7f6;
  undefined1 local_7f5;
  undefined4 local_7f4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  int local_790;
  int iStack_78c;
  int iStack_788;
  int iStack_784;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 *local_728;
  undefined4 local_720;
  undefined4 uStack_71c;
  undefined4 uStack_718;
  undefined4 uStack_714;
  undefined4 local_710;
  int local_70c;
  float local_708;
  char local_701;
  undefined1 local_700 [64];
  undefined4 local_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 uStack_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 uStack_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 uStack_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 uStack_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined8 local_440;
  undefined8 uStack_438;
  ulong local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined1 local_400 [16];
  undefined1 auStack_3f0 [16];
  undefined4 local_3e0;
  undefined4 local_3dc;
  undefined4 local_3d8;
  undefined4 local_3d4;
  undefined4 local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  undefined4 local_3c4;
  undefined1 local_3c0 [32];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined4 local_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  undefined4 local_1f0;
  undefined4 local_1ec;
  undefined4 local_1e8;
  undefined4 local_1e4;
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined4 local_1b4;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined2 local_f4;
  undefined2 local_f2;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined1 local_b0 [16];
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined1 local_90 [16];
  undefined2 local_80;
  undefined2 local_7e;
  undefined2 local_7c;
  undefined2 local_7a;
  undefined2 local_78;
  undefined2 local_76;
  undefined2 local_74;
  undefined2 local_72;
  undefined1 local_70 [16];
  undefined2 local_60;
  undefined2 local_5e;
  undefined2 local_5c;
  undefined2 local_5a;
  undefined2 local_58;
  undefined2 local_56;
  undefined2 local_54;
  undefined2 local_52;
  
  local_d84 = 0;
  local_e00 = vbroadcastss_avx512f(ZEXT416((uint)in_XMM0_Da));
  local_cf1 = 0x7f;
  local_cc9 = 0x7f;
  local_cca = 0x7f;
  local_ccb = 0x7f;
  local_ccc = 0x7f;
  local_ccd = 0x7f;
  local_cce = 0x7f;
  local_ccf = 0x7f;
  local_cd0 = 0x7f;
  local_cd1 = 0x7f;
  local_cd2 = 0x7f;
  local_cd3 = 0x7f;
  local_cd4 = 0x7f;
  local_cd5 = 0x7f;
  local_cd6 = 0x7f;
  local_cd7 = 0x7f;
  local_cd8 = 0x7f;
  auVar1 = vpinsrb_avx(ZEXT116(0x7f),0x7f,1);
  auVar1 = vpinsrb_avx(auVar1,0x7f,2);
  auVar1 = vpinsrb_avx(auVar1,0x7f,3);
  auVar1 = vpinsrb_avx(auVar1,0x7f,4);
  auVar1 = vpinsrb_avx(auVar1,0x7f,5);
  auVar1 = vpinsrb_avx(auVar1,0x7f,6);
  auVar1 = vpinsrb_avx(auVar1,0x7f,7);
  auVar1 = vpinsrb_avx(auVar1,0x7f,8);
  auVar1 = vpinsrb_avx(auVar1,0x7f,9);
  auVar1 = vpinsrb_avx(auVar1,0x7f,10);
  auVar1 = vpinsrb_avx(auVar1,0x7f,0xb);
  auVar1 = vpinsrb_avx(auVar1,0x7f,0xc);
  auVar1 = vpinsrb_avx(auVar1,0x7f,0xd);
  auVar1 = vpinsrb_avx(auVar1,0x7f,0xe);
  local_cf0 = vpinsrb_avx(auVar1,0x7f,0xf);
  local_e10 = local_cf0._0_8_;
  uStack_e08 = local_cf0._8_8_;
  local_d80 = in_RDX;
  local_d70 = in_RDI;
  for (; local_d84 + 0xf < in_ESI; local_d84 = local_d84 + 0x10) {
    local_cc8 = local_d70;
    auVar11 = *(undefined1 (*) [56])*local_d70;
    uStack_c48 = *(undefined8 *)(*local_d70 + 0x38);
    local_e80._0_8_ = auVar11._0_8_;
    local_c80 = local_e80._0_8_;
    local_e80._8_8_ = auVar11._8_8_;
    uStack_c78 = local_e80._8_8_;
    local_e80._16_8_ = auVar11._16_8_;
    uStack_c70 = local_e80._16_8_;
    local_e80._24_8_ = auVar11._24_8_;
    uStack_c68 = local_e80._24_8_;
    local_e80._32_8_ = auVar11._32_8_;
    uStack_c60 = local_e80._32_8_;
    local_e80._40_8_ = auVar11._40_8_;
    uStack_c58 = local_e80._40_8_;
    local_e80._48_8_ = auVar11._48_8_;
    uStack_c50 = local_e80._48_8_;
    local_cc0 = local_e00._0_8_;
    uStack_cb8 = local_e00._8_8_;
    uStack_cb0 = local_e00._16_8_;
    uStack_ca8 = local_e00._24_8_;
    uStack_ca0 = local_e00._32_8_;
    uStack_c98 = local_e00._40_8_;
    uStack_c90 = local_e00._48_8_;
    uStack_c88 = local_e00._56_8_;
    local_e80 = vmulps_avx512f(*local_d70,local_e00);
    local_a48 = local_e80;
    local_9b8 = 0x3f000000;
    local_a00 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
    local_ac0 = local_a00._0_8_;
    uStack_ab8 = local_a00._8_8_;
    uStack_ab0 = local_a00._16_8_;
    uStack_aa8 = local_a00._24_8_;
    uStack_aa0 = local_a00._32_8_;
    uStack_a98 = local_a00._40_8_;
    uStack_a90 = local_a00._48_8_;
    uStack_a88 = local_a00._56_8_;
    local_684 = 0x80000000;
    auVar23 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
    local_700 = vmovdqa64_avx512f(auVar23);
    auVar23 = vmovdqa64_avx512f(local_700);
    local_a40 = vmovdqa64_avx512f(auVar23);
    auVar23 = vmovdqa64_avx512f(local_a40);
    local_b00 = vmovdqa64_avx512f(auVar23);
    local_640 = local_e80._0_8_;
    uStack_638 = local_e80._8_8_;
    uStack_630 = local_e80._16_8_;
    uStack_628 = local_e80._24_8_;
    uStack_620 = local_e80._32_8_;
    uStack_618 = local_e80._40_8_;
    uStack_610 = local_e80._48_8_;
    uStack_608 = local_e80._56_8_;
    local_680 = local_b00._0_8_;
    uStack_678 = local_b00._8_8_;
    uStack_670 = local_b00._16_8_;
    uStack_668 = local_b00._24_8_;
    uStack_660 = local_b00._32_8_;
    uStack_658 = local_b00._40_8_;
    uStack_650 = local_b00._48_8_;
    uStack_648 = local_b00._56_8_;
    auVar23 = vmovdqa64_avx512f(local_e80);
    auVar24 = vmovdqa64_avx512f(local_b00);
    auVar23 = vpandd_avx512f(auVar23,auVar24);
    local_b40 = vmovdqa64_avx512f(auVar23);
    local_5c0 = local_a00._0_8_;
    uStack_5b8 = local_a00._8_8_;
    uStack_5b0 = local_a00._16_8_;
    uStack_5a8 = local_a00._24_8_;
    uStack_5a0 = local_a00._32_8_;
    uStack_598 = local_a00._40_8_;
    uStack_590 = local_a00._48_8_;
    uStack_588 = local_a00._56_8_;
    local_600 = local_b40._0_8_;
    uStack_5f8 = local_b40._8_8_;
    uStack_5f0 = local_b40._16_8_;
    uStack_5e8 = local_b40._24_8_;
    uStack_5e0 = local_b40._32_8_;
    uStack_5d8 = local_b40._40_8_;
    uStack_5d0 = local_b40._48_8_;
    uStack_5c8 = local_b40._56_8_;
    auVar23 = vmovdqa64_avx512f(local_a00);
    auVar24 = vmovdqa64_avx512f(local_b40);
    auVar23 = vpord_avx512f(auVar23,auVar24);
    local_b80 = vmovdqa64_avx512f(auVar23);
    local_540 = local_e80._0_8_;
    uStack_538 = local_e80._8_8_;
    uStack_530 = local_e80._16_8_;
    uStack_528 = local_e80._24_8_;
    uStack_520 = local_e80._32_8_;
    uStack_518 = local_e80._40_8_;
    uStack_510 = local_e80._48_8_;
    uStack_508 = local_e80._56_8_;
    local_580 = local_b80._0_8_;
    uStack_578 = local_b80._8_8_;
    uStack_570 = local_b80._16_8_;
    uStack_568 = local_b80._24_8_;
    uStack_560 = local_b80._32_8_;
    uStack_558 = local_b80._40_8_;
    uStack_550 = local_b80._48_8_;
    uStack_548 = local_b80._56_8_;
    local_bc0 = vaddps_avx512f(local_e80,local_b80);
    local_500 = local_bc0._0_8_;
    uStack_4f8 = local_bc0._8_8_;
    uStack_4f0 = local_bc0._16_8_;
    uStack_4e8 = local_bc0._24_8_;
    uStack_4e0 = local_bc0._32_8_;
    uStack_4d8 = local_bc0._40_8_;
    uStack_4d0 = local_bc0._48_8_;
    uStack_4c8 = local_bc0._56_8_;
    auVar23 = vcvttps2dq_avx512f(local_bc0);
    local_4c0 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
    local_c00 = vmovdqa64_avx512f(auVar23);
    auVar23 = vmovdqa64_avx512f(local_c00);
    local_480 = vmovdqa64_avx512f(auVar23);
    auVar23 = vmovdqa64_avx512f(local_480);
    auVar21 = vpmovsdb_avx512f(auVar23);
    local_c10._0_8_ = auVar21._0_8_;
    local_410 = local_c10._0_8_;
    local_c10._8_8_ = auVar21._8_8_;
    uStack_408 = local_c10._8_8_;
    local_9b1 = 0x81;
    local_9a0 = 0x81;
    auVar1 = vpinsrb_avx(ZEXT116(0x81),0x81,1);
    auVar1 = vpinsrb_avx(auVar1,0x81,2);
    auVar1 = vpinsrb_avx(auVar1,0x81,3);
    auVar1 = vpinsrb_avx(auVar1,0x81,4);
    auVar1 = vpinsrb_avx(auVar1,0x81,5);
    auVar1 = vpinsrb_avx(auVar1,0x81,6);
    auVar1 = vpinsrb_avx(auVar1,0x81,7);
    auVar1 = vpinsrb_avx(auVar1,0x81,8);
    auVar1 = vpinsrb_avx(auVar1,0x81,9);
    auVar1 = vpinsrb_avx(auVar1,0x81,10);
    auVar1 = vpinsrb_avx(auVar1,0x81,0xb);
    auVar1 = vpinsrb_avx(auVar1,0x81,0xc);
    auVar1 = vpinsrb_avx(auVar1,0x81,0xd);
    auVar1 = vpinsrb_avx(auVar1,0x81,0xe);
    local_9b0 = vpinsrb_avx(auVar1,0x81,0xf);
    local_420 = local_9b0._0_8_;
    uStack_418 = local_9b0._8_8_;
    local_c10 = vpmaxsb_avx(auVar21,local_9b0);
    local_980 = local_c10._0_8_;
    uStack_978 = local_c10._8_8_;
    local_990 = local_cf0._0_8_;
    uStack_988 = local_cf0._8_8_;
    local_e90 = vpaddb_avx(local_c10,local_cf0);
    local_d48 = local_d80;
    local_d60 = local_e90._0_8_;
    uStack_d58 = local_e90._8_8_;
    *(undefined8 *)local_d80 = local_e90._0_8_;
    *(undefined8 *)(local_d80 + 8) = local_e90._8_8_;
    local_d70 = local_d70 + 1;
    local_d80 = local_d80 + 0x10;
    local_99f = local_9a0;
    local_99e = local_9a0;
    local_99d = local_9a0;
    local_99c = local_9a0;
    local_99b = local_9a0;
    local_99a = local_9a0;
    local_999 = local_9a0;
    local_998 = local_9a0;
    local_997 = local_9a0;
    local_996 = local_9a0;
    local_995 = local_9a0;
    local_994 = local_9a0;
    local_993 = local_9a0;
    local_992 = local_9a0;
    local_991 = local_9a0;
  }
  auVar1 = vinsertps_avx(ZEXT416((uint)in_XMM0_Da),ZEXT416((uint)in_XMM0_Da),0x10);
  auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)in_XMM0_Da),0x20);
  auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)in_XMM0_Da),0x30);
  auVar21 = vinsertps_avx(ZEXT416((uint)in_XMM0_Da),ZEXT416((uint)in_XMM0_Da),0x10);
  auVar21 = vinsertps_avx(auVar21,ZEXT416((uint)in_XMM0_Da),0x20);
  auVar21 = vinsertps_avx(auVar21,ZEXT416((uint)in_XMM0_Da),0x30);
  auVar26._16_16_ = auVar1;
  auVar26._0_16_ = auVar21;
  local_3c0._0_8_ = auVar21._0_8_;
  local_3c0._8_8_ = auVar21._8_8_;
  local_3c0._16_8_ = auVar1._0_8_;
  local_3c0._24_8_ = auVar1._8_8_;
  local_ec0 = local_3c0._0_8_;
  uStack_eb8 = local_3c0._8_8_;
  uStack_eb0 = local_3c0._16_8_;
  uStack_ea8 = local_3c0._24_8_;
  uVar2 = uStack_ec8;
  for (; uStack_ec8 = uVar2, fVar20 = uStack_ec8._4_4_, fVar19 = uStack_ed0._4_4_,
      fVar18 = uStack_ed8._4_4_, fVar17 = local_ee0._4_4_, local_d84 + 7 < in_ESI;
      local_d84 = local_d84 + 8) {
    local_968 = local_d70;
    uVar3 = *(undefined8 *)*local_d70;
    uVar4 = *(undefined8 *)(*local_d70 + 8);
    uVar5 = *(undefined8 *)(*local_d70 + 0x10);
    uVar6 = *(undefined8 *)(*local_d70 + 0x18);
    local_940._0_4_ = (float)uVar3;
    local_940._4_4_ = (float)((ulong)uVar3 >> 0x20);
    uStack_938._0_4_ = (float)uVar4;
    uStack_938._4_4_ = (float)((ulong)uVar4 >> 0x20);
    uStack_930._0_4_ = (float)uVar5;
    uStack_930._4_4_ = (float)((ulong)uVar5 >> 0x20);
    uStack_928._0_4_ = (float)uVar6;
    uStack_928._4_4_ = (float)((ulong)uVar6 >> 0x20);
    local_960._0_4_ = auVar21._0_4_;
    local_960._4_4_ = auVar21._4_4_;
    uStack_958._0_4_ = auVar21._8_4_;
    uStack_958._4_4_ = auVar21._12_4_;
    uStack_950._0_4_ = auVar1._0_4_;
    uStack_950._4_4_ = auVar1._4_4_;
    uStack_948._0_4_ = auVar1._8_4_;
    local_940._0_4_ = (float)local_940 * (float)local_960;
    local_ee0._4_4_ = local_940._4_4_ * local_960._4_4_;
    uStack_938._0_4_ = (float)uStack_938 * (float)uStack_958;
    uStack_ed8._4_4_ = uStack_938._4_4_ * uStack_958._4_4_;
    uStack_930._0_4_ = (float)uStack_930 * (float)uStack_950;
    uStack_ed0._4_4_ = uStack_930._4_4_ * uStack_950._4_4_;
    uStack_928._0_4_ = (float)uStack_928 * (float)uStack_948;
    local_ee0 = CONCAT44(local_ee0._4_4_,(float)local_940);
    uStack_ed8 = CONCAT44(uStack_ed8._4_4_,(float)uStack_938);
    uStack_ed0 = CONCAT44(uStack_ed0._4_4_,(float)uStack_930);
    uStack_ec8._4_4_ = uStack_928._4_4_;
    local_830 = &local_ee0;
    local_7f4 = 0x3f000000;
    local_3e0 = 0x3f000000;
    auVar22 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
    auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f000000),0x20);
    local_400 = vinsertps_avx(auVar22,ZEXT416(0x3f000000),0x30);
    auVar22 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
    auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f000000),0x20);
    auStack_3f0 = vinsertps_avx(auVar22,ZEXT416(0x3f000000),0x30);
    local_860 = local_400._0_8_;
    uStack_858 = local_400._8_8_;
    uStack_850 = auStack_3f0._0_8_;
    uStack_848 = auStack_3f0._8_8_;
    local_344 = 0x80000000;
    local_1f0 = 0x80000000;
    auVar22 = vpinsrd_avx(ZEXT416(0x80000000),0x80000000,1);
    auVar22 = vpinsrd_avx(auVar22,0x80000000,2);
    local_220 = vpinsrd_avx(auVar22,0x80000000,3);
    auVar22 = vpinsrd_avx(ZEXT416(0x80000000),0x80000000,1);
    auVar22 = vpinsrd_avx(auVar22,0x80000000,2);
    auStack_210 = vpinsrd_avx(auVar22,0x80000000,3);
    local_380 = local_220._0_8_;
    uStack_378 = local_220._8_8_;
    uStack_370 = auStack_210._0_8_;
    uStack_368 = auStack_210._8_8_;
    local_880 = local_220._0_8_;
    uStack_878 = local_220._8_8_;
    uStack_870 = auStack_210._0_8_;
    uStack_868 = auStack_210._8_8_;
    local_320 = CONCAT44(local_ee0._4_4_,(float)local_940);
    uStack_318 = CONCAT44(uStack_ed8._4_4_,(float)uStack_938);
    uStack_310 = CONCAT44(uStack_ed0._4_4_,(float)uStack_930);
    uStack_308 = CONCAT44(uStack_928._4_4_,(float)uStack_928);
    auVar13._4_4_ = local_ee0._4_4_;
    auVar13._0_4_ = (float)local_940;
    auVar13._8_4_ = (float)uStack_938;
    auVar13._12_4_ = uStack_ed8._4_4_;
    auVar13._16_4_ = (float)uStack_930;
    auVar13._20_4_ = uStack_ed0._4_4_;
    auVar13._24_4_ = (float)uStack_928;
    auVar13._28_4_ = uStack_928._4_4_;
    local_340 = local_220._0_8_;
    uStack_338 = local_220._8_8_;
    uStack_330 = auStack_210._0_8_;
    uStack_328 = auStack_210._8_8_;
    auVar7._16_8_ = auStack_210._0_8_;
    auVar7._0_16_ = local_220;
    auVar7._24_8_ = auStack_210._8_8_;
    local_8a0 = vpand_avx2(auVar13,auVar7);
    local_2e0 = local_400._0_8_;
    uStack_2d8 = local_400._8_8_;
    uStack_2d0 = auStack_3f0._0_8_;
    uStack_2c8 = auStack_3f0._8_8_;
    local_300 = local_8a0._0_8_;
    uStack_2f8 = local_8a0._8_8_;
    uStack_2f0 = local_8a0._16_8_;
    uStack_2e8 = local_8a0._24_8_;
    auVar8._16_8_ = auStack_3f0._0_8_;
    auVar8._0_16_ = local_400;
    auVar8._24_8_ = auStack_3f0._8_8_;
    local_8c0 = vpor_avx2(auVar8,local_8a0);
    local_2a0 = CONCAT44(local_ee0._4_4_,(float)local_940);
    uStack_298 = CONCAT44(uStack_ed8._4_4_,(float)uStack_938);
    uStack_290 = CONCAT44(uStack_ed0._4_4_,(float)uStack_930);
    uStack_288 = CONCAT44(uStack_928._4_4_,(float)uStack_928);
    local_2c0._0_4_ = local_8c0._0_4_;
    local_2c0._4_4_ = local_8c0._4_4_;
    uStack_2b8._0_4_ = local_8c0._8_4_;
    uStack_2b8._4_4_ = local_8c0._12_4_;
    uStack_2b0._0_4_ = local_8c0._16_4_;
    uStack_2b0._4_4_ = local_8c0._20_4_;
    uStack_2a8._0_4_ = local_8c0._24_4_;
    uStack_2a8._4_4_ = local_8c0._28_4_;
    local_8e0 = (float)local_940 + (float)local_2c0;
    fStack_8dc = local_ee0._4_4_ + local_2c0._4_4_;
    fStack_8d8 = (float)uStack_938 + (float)uStack_2b8;
    fStack_8d4 = uStack_ed8._4_4_ + uStack_2b8._4_4_;
    fStack_8d0 = (float)uStack_930 + (float)uStack_2b0;
    fStack_8cc = uStack_ed0._4_4_ + uStack_2b0._4_4_;
    fStack_8c8 = (float)uStack_928 + (float)uStack_2a8;
    fStack_8c4 = uStack_928._4_4_ + uStack_2a8._4_4_;
    local_280 = CONCAT44(fStack_8dc,local_8e0);
    uStack_278 = CONCAT44(fStack_8d4,fStack_8d8);
    uStack_270 = CONCAT44(fStack_8cc,fStack_8d0);
    uStack_268 = CONCAT44(fStack_8c4,fStack_8c8);
    local_900 = (int)local_8e0;
    iStack_8fc = (int)fStack_8dc;
    iStack_8f8 = (int)fStack_8d8;
    iStack_8f4 = (int)fStack_8d4;
    iStack_8f0 = (int)fStack_8d0;
    iStack_8ec = (int)fStack_8cc;
    iStack_8e8 = (int)fStack_8c8;
    iStack_8e4 = (int)fStack_8c4;
    local_260 = CONCAT44(iStack_8fc,local_900);
    uStack_258 = CONCAT44(iStack_8f4,iStack_8f8);
    uStack_250 = CONCAT44(iStack_8ec,iStack_8f0);
    uStack_248 = CONCAT44(iStack_8e4,iStack_8e8);
    auVar9._8_8_ = uStack_258;
    auVar9._0_8_ = local_260;
    auVar9._16_8_ = uStack_250;
    auVar9._24_8_ = uStack_248;
    auVar22 = vpmovsdb_avx512vl(auVar9);
    local_430 = auVar22._0_8_;
    uStack_428 = 0;
    local_821 = 0x81;
    local_804 = 0x81;
    auVar22 = vpinsrb_avx(ZEXT116(0x81),0x81,1);
    auVar22 = vpinsrb_avx(auVar22,0x81,2);
    auVar22 = vpinsrb_avx(auVar22,0x81,3);
    auVar22 = vpinsrb_avx(auVar22,0x81,4);
    auVar22 = vpinsrb_avx(auVar22,0x81,5);
    auVar22 = vpinsrb_avx(auVar22,0x81,6);
    auVar22 = vpinsrb_avx(auVar22,0x81,7);
    auVar22 = vpinsrb_avx(auVar22,0x81,8);
    auVar22 = vpinsrb_avx(auVar22,0x81,9);
    auVar22 = vpinsrb_avx(auVar22,0x81,10);
    auVar22 = vpinsrb_avx(auVar22,0x81,0xb);
    auVar22 = vpinsrb_avx(auVar22,0x81,0xc);
    auVar22 = vpinsrb_avx(auVar22,0x81,0xd);
    auVar22 = vpinsrb_avx(auVar22,0x81,0xe);
    local_820 = vpinsrb_avx(auVar22,0x81,0xf);
    local_440 = local_820._0_8_;
    uStack_438 = local_820._8_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_430;
    local_910 = vpmaxsb_avx(auVar22,local_820);
    local_230 = local_910._0_8_;
    uStack_228 = local_910._8_8_;
    *(undefined8 *)local_d80 = local_910._0_8_;
    *local_d80 = *local_d80 + '\x7f';
    local_d80[1] = local_d80[1] + '\x7f';
    local_d80[2] = local_d80[2] + '\x7f';
    local_d80[3] = local_d80[3] + '\x7f';
    local_d80[4] = local_d80[4] + '\x7f';
    local_d80[5] = local_d80[5] + '\x7f';
    local_d80[6] = local_d80[6] + '\x7f';
    local_d80[7] = local_d80[7] + '\x7f';
    local_d70 = (undefined1 (*) [64])(*local_d70 + 0x20);
    local_d80 = local_d80 + 8;
    uVar2 = CONCAT44(uStack_928._4_4_,(float)uStack_928);
    local_960 = local_3c0._0_8_;
    uStack_958 = local_3c0._8_8_;
    uStack_950 = local_3c0._16_8_;
    uStack_948 = local_3c0._24_8_;
    local_940 = uVar3;
    uStack_938 = uVar4;
    uStack_930 = uVar5;
    uStack_928 = uVar6;
    local_803 = local_804;
    local_802 = local_804;
    local_801 = local_804;
    local_800 = local_804;
    local_7ff = local_804;
    local_7fe = local_804;
    local_7fd = local_804;
    local_7fc = local_804;
    local_7fb = local_804;
    local_7fa = local_804;
    local_7f9 = local_804;
    local_7f8 = local_804;
    local_7f7 = local_804;
    local_7f6 = local_804;
    local_7f5 = local_804;
    local_3dc = local_3e0;
    local_3d8 = local_3e0;
    local_3d4 = local_3e0;
    local_3d0 = local_3e0;
    local_3cc = local_3e0;
    local_3c8 = local_3e0;
    local_3c4 = local_3e0;
    local_2c0 = local_8c0._0_8_;
    uStack_2b8 = local_8c0._8_8_;
    uStack_2b0 = local_8c0._16_8_;
    uStack_2a8 = local_8c0._24_8_;
    local_1ec = local_1f0;
    local_1e8 = local_1f0;
    local_1e4 = local_1f0;
    local_1e0 = local_1f0;
    local_1dc = local_1f0;
    local_1d8 = local_1f0;
    local_1d4 = local_1f0;
  }
  for (; fVar15 = uStack_ef8._4_4_, fVar14 = local_f00._4_4_, uVar2 = local_f00, uVar3 = uStack_ef8,
      uVar4 = local_ee0, uVar5 = uStack_ed8, uVar6 = uStack_ed0, uVar16 = uStack_ec8,
      local_d78 = in_XMM0_Da, local_d74 = in_ESI, local_d40 = local_e00, local_3c0 = auVar26,
      local_f00._4_4_ = fVar14, uStack_ef8._4_4_ = fVar15, local_d84 + 3 < in_ESI;
      local_d84 = local_d84 + 4) {
    local_d68 = local_d70;
    uVar2 = *(undefined8 *)*local_d70;
    uVar3 = *(undefined8 *)(*local_d70 + 8);
    local_7c0._0_4_ = (float)uVar2;
    local_7c0._4_4_ = (float)((ulong)uVar2 >> 0x20);
    uStack_7b8._0_4_ = (float)uVar3;
    uStack_7b8._4_4_ = (float)((ulong)uVar3 >> 0x20);
    local_7c0._0_4_ = (float)local_7c0 * in_XMM0_Da;
    local_f00._4_4_ = local_7c0._4_4_ * in_XMM0_Da;
    uStack_7b8._0_4_ = (float)uStack_7b8 * in_XMM0_Da;
    uStack_ef8._4_4_ = uStack_7b8._4_4_ * in_XMM0_Da;
    local_f00 = CONCAT44(local_f00._4_4_,(float)local_7c0);
    uStack_ef8 = CONCAT44(uStack_ef8._4_4_,(float)uStack_7b8);
    local_728 = &local_f00;
    local_710 = 0x3f000000;
    local_720 = 0x3f000000;
    local_740 = 0x3f0000003f000000;
    uStack_738 = 0x3f0000003f000000;
    local_1b4 = 0x80000000;
    local_a0 = 0x80000000;
    auVar1 = vpinsrd_avx(ZEXT416(0x80000000),0x80000000,1);
    auVar1 = vpinsrd_avx(auVar1,0x80000000,2);
    local_b0 = vpinsrd_avx(auVar1,0x80000000,3);
    local_1d0 = local_b0._0_8_;
    uStack_1c8 = local_b0._8_8_;
    local_750 = local_b0._0_8_;
    uStack_748 = local_b0._8_8_;
    local_1a0 = CONCAT44(local_f00._4_4_,(float)local_7c0);
    uStack_198 = CONCAT44(uStack_ef8._4_4_,(float)uStack_7b8);
    auVar12._4_4_ = local_f00._4_4_;
    auVar12._0_4_ = (float)local_7c0;
    auVar12._8_4_ = (float)uStack_7b8;
    auVar12._12_4_ = uStack_ef8._4_4_;
    local_1b0 = local_b0._0_8_;
    uStack_1a8 = local_b0._8_8_;
    local_760 = vpand_avx(auVar12,local_b0);
    local_190 = local_760._0_8_;
    uStack_188 = local_760._8_8_;
    auVar1._8_8_ = 0x3f0000003f000000;
    auVar1._0_8_ = 0x3f0000003f000000;
    local_770 = vpor_avx(auVar1,local_760);
    local_160 = CONCAT44(local_f00._4_4_,(float)local_7c0);
    uStack_158 = CONCAT44(uStack_ef8._4_4_,(float)uStack_7b8);
    local_170._0_4_ = local_770._0_4_;
    local_170._4_4_ = local_770._4_4_;
    uStack_168._0_4_ = local_770._8_4_;
    uStack_168._4_4_ = local_770._12_4_;
    local_780 = (float)local_7c0 + (float)local_170;
    fStack_77c = local_f00._4_4_ + local_170._4_4_;
    fStack_778 = (float)uStack_7b8 + (float)uStack_168;
    fStack_774 = uStack_ef8._4_4_ + uStack_168._4_4_;
    local_150 = CONCAT44(fStack_77c,local_780);
    uStack_148 = CONCAT44(fStack_774,fStack_778);
    local_790 = (int)local_780;
    iStack_78c = (int)fStack_77c;
    iStack_788 = (int)fStack_778;
    iStack_784 = (int)fStack_774;
    local_140 = CONCAT44(iStack_78c,local_790);
    uStack_138 = CONCAT44(iStack_784,iStack_788);
    auVar10._8_8_ = uStack_138;
    auVar10._0_8_ = local_140;
    auVar21._8_8_ = uStack_138;
    auVar21._0_8_ = local_140;
    auVar1 = vpackssdw_avx(auVar10,auVar21);
    local_7a0._0_8_ = auVar1._0_8_;
    local_110 = local_7a0._0_8_;
    local_7a0._8_8_ = auVar1._8_8_;
    uStack_108 = local_7a0._8_8_;
    local_f2 = 0x7f;
    local_80 = 0x7f;
    auVar21 = vpinsrw_avx(ZEXT216(0x7f),0x7f,1);
    auVar21 = vpinsrw_avx(auVar21,0x7f,2);
    auVar21 = vpinsrw_avx(auVar21,0x7f,3);
    auVar21 = vpinsrw_avx(auVar21,0x7f,4);
    auVar21 = vpinsrw_avx(auVar21,0x7f,5);
    auVar21 = vpinsrw_avx(auVar21,0x7f,6);
    local_90 = vpinsrw_avx(auVar21,0x7f,7);
    local_120 = local_90._0_8_;
    uStack_118 = local_90._8_8_;
    auVar21 = vpminsw_avx(auVar1,local_90);
    local_7a0._0_8_ = auVar21._0_8_;
    local_e0 = local_7a0._0_8_;
    local_7a0._8_8_ = auVar21._8_8_;
    uStack_d8 = local_7a0._8_8_;
    local_f4 = 0xff81;
    local_60 = 0xff81;
    auVar1 = vpinsrw_avx(ZEXT216(0xff81),0xff81,1);
    auVar1 = vpinsrw_avx(auVar1,0xff81,2);
    auVar1 = vpinsrw_avx(auVar1,0xff81,3);
    auVar1 = vpinsrw_avx(auVar1,0xff81,4);
    auVar1 = vpinsrw_avx(auVar1,0xff81,5);
    auVar1 = vpinsrw_avx(auVar1,0xff81,6);
    local_70 = vpinsrw_avx(auVar1,0xff81,7);
    local_f0 = local_70._0_8_;
    uStack_e8 = local_70._8_8_;
    local_7a0 = vpmaxsw_avx(auVar21,local_70);
    local_d0 = local_7a0._0_8_;
    uStack_c8 = local_7a0._8_8_;
    local_7b0 = vpacksswb_avx(local_7a0,local_7a0);
    local_240 = local_7b0._0_8_;
    uStack_238 = local_7b0._8_8_;
    *(int *)local_d80 = local_7b0._0_4_;
    *local_d80 = *local_d80 + '\x7f';
    local_d80[1] = local_d80[1] + '\x7f';
    local_d80[2] = local_d80[2] + '\x7f';
    local_d80[3] = local_d80[3] + '\x7f';
    local_d70 = (undefined1 (*) [64])(*local_d70 + 0x10);
    local_d80 = local_d80 + 4;
    local_7c0 = uVar2;
    uStack_7b8 = uVar3;
    uStack_71c = local_720;
    uStack_718 = local_720;
    uStack_714 = local_720;
    local_180 = local_740;
    uStack_178 = uStack_738;
    local_170 = local_770._0_8_;
    uStack_168 = local_770._8_8_;
    local_130 = local_140;
    uStack_128 = uStack_138;
    local_c0 = local_d0;
    uStack_b8 = uStack_c8;
    local_9c = local_a0;
    local_98 = local_a0;
    local_94 = local_a0;
    local_7e = local_80;
    local_7c = local_80;
    local_7a = local_80;
    local_78 = local_80;
    local_76 = local_80;
    local_74 = local_80;
    local_72 = local_80;
    local_5e = local_60;
    local_5c = local_60;
    local_5a = local_60;
    local_58 = local_60;
    local_56 = local_60;
    local_54 = local_60;
    local_52 = local_60;
  }
  for (; uStack_ec8._4_4_ = fVar20, uStack_ed0._4_4_ = fVar19, uStack_ed8._4_4_ = fVar18,
      local_ee0._4_4_ = fVar17, uStack_ec8 = uVar16, uStack_ed0 = uVar6, uStack_ed8 = uVar5,
      local_ee0 = uVar4, uStack_ef8 = uVar3, local_f00 = uVar2, fVar15 = uStack_ec8._4_4_,
      fVar14 = uStack_ed0._4_4_, fVar20 = uStack_ed8._4_4_, fVar19 = local_ee0._4_4_,
      fVar18 = uStack_ef8._4_4_, fVar17 = local_f00._4_4_, local_d84 < local_d74;
      local_d84 = local_d84 + 1) {
    local_708 = *(float *)*local_d70 * local_d78;
    local_d70 = (undefined1 (*) [64])(*local_d70 + 4);
    uVar2 = local_f00;
    local_f00._4_4_ = fVar17;
    uVar3 = uStack_ef8;
    uStack_ef8._4_4_ = fVar18;
    uVar4 = local_ee0;
    local_ee0._4_4_ = fVar19;
    uVar5 = uStack_ed8;
    uStack_ed8._4_4_ = fVar20;
    uVar6 = uStack_ed0;
    uStack_ed0._4_4_ = fVar14;
    uVar16 = uStack_ec8;
    uStack_ec8._4_4_ = fVar15;
    dVar25 = std::round((double)(ulong)(uint)local_708);
    uVar16 = uStack_ec8;
    uVar6 = uStack_ed0;
    uVar5 = uStack_ed8;
    uVar4 = local_ee0;
    uVar3 = uStack_ef8;
    uVar2 = local_f00;
    local_70c = (int)SUB84(dVar25,0);
    if (local_70c < 0x80) {
      if (local_70c < -0x7f) {
        local_701 = -0x7f;
      }
      else {
        local_701 = (char)local_70c;
      }
    }
    else {
      local_701 = '\x7f';
    }
    *local_d80 = local_701;
    local_d80 = local_d80 + 1;
    fVar17 = local_ee0._4_4_;
    fVar18 = uStack_ed8._4_4_;
    fVar19 = uStack_ed0._4_4_;
    fVar20 = uStack_ec8._4_4_;
  }
  return;
}

Assistant:

static void lstm_dynamic_quantize_scale2int8(const float* ptr, int size, float scale, signed char* outptr)
{
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        lstm_dynamic_quantize_scale2int8_avx512vnni(ptr, size, scale, outptr);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX__ && !__AVX512F__ && !__AVXVNNI__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        lstm_dynamic_quantize_scale2int8_avxvnni(ptr, size, scale, outptr);
        return;
    }
#endif

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _scale_avx512 = _mm512_set1_ps(scale);
#if __AVX512VNNI__
    __m128i _v127 = _mm_set1_epi8(127);
#endif
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        _p = _mm512_mul_ps(_p, _scale_avx512);
        __m128i _outp = float2int8_avx512(_p);
#if __AVX512VNNI__
        _outp = _mm_add_epi8(_outp, _v127);
#endif
        _mm_storeu_si128((__m128i*)outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _scale_avx = _mm256_set1_ps(scale);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        _p = _mm256_mul_ps(_p, _scale_avx);
        *(int64_t*)outptr = float2int8_avx(_p);
#if __AVXVNNI__ || __AVX512VNNI__
        outptr[0] += 127;
        outptr[1] += 127;
        outptr[2] += 127;
        outptr[3] += 127;
        outptr[4] += 127;
        outptr[5] += 127;
        outptr[6] += 127;
        outptr[7] += 127;
#endif
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _scale = _mm_set1_ps(scale);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        _p = _mm_mul_ps(_p, _scale);
        *(int32_t*)outptr = float2int8_sse(_p);
#ifndef _MSC_VER
        // vs2019 crash on 128bit vnni :L   --- nihui
#if __AVXVNNI__ || __AVX512VNNI__
        outptr[0] += 127;
        outptr[1] += 127;
        outptr[2] += 127;
        outptr[3] += 127;
#endif
#endif
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr++ = float2int8(*ptr++ * scale);
    }
}